

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

tmbstr ParseValue(TidyDocImpl *doc,ctmbstr name,Bool foldCase,Bool *isempty,int *pdelim)

{
  Lexer *lexer_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Bool BVar4;
  int iVar5;
  bool bVar6;
  tmbstr local_78;
  TidyDocImpl *pTStack_68;
  uint q;
  tmbstr value;
  uint quotewarning;
  uint delim;
  uint lastc;
  uint c;
  Bool munge;
  Bool seen_gt;
  int start;
  int len;
  Lexer *lexer;
  int *pdelim_local;
  Bool *isempty_local;
  Bool foldCase_local;
  ctmbstr name_local;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  bVar1 = false;
  value._4_4_ = 0;
  *pdelim = 0x22;
  bVar6 = (int)(doc->config).value[0x2c].v == 0;
  do {
    uVar2 = prvTidyReadChar(doc->docIn);
    if (uVar2 == 0xffffffff) {
      prvTidyUngetChar(0xffffffff,doc->docIn);
      break;
    }
    BVar4 = prvTidyIsWhite(uVar2);
  } while (BVar4 != no);
  if (((uVar2 == 0x3d) || (uVar2 == 0x22)) || (uVar2 == 0x27)) {
    do {
      uVar2 = prvTidyReadChar(doc->docIn);
      if (uVar2 == 0xffffffff) {
        prvTidyUngetChar(0xffffffff,doc->docIn);
        break;
      }
      BVar4 = prvTidyIsWhite(uVar2);
    } while (BVar4 != no);
    if ((uVar2 != 0x22) && (uVar2 != 0x27)) {
      if (uVar2 == 0x3c) {
        uVar2 = lexer_00->lexsize;
        prvTidyAddCharToLexer(lexer_00,0x3c);
        iVar5 = ParseServerInstruction(doc);
        *pdelim = iVar5;
        uVar3 = lexer_00->lexsize - uVar2;
        lexer_00->lexsize = uVar2;
        if ((int)uVar3 < 1) {
          local_78 = (tmbstr)0x0;
        }
        else {
          local_78 = prvTidytmbstrndup(doc->allocator,lexer_00->lexbuf + (int)uVar2,uVar3);
        }
        return local_78;
      }
      prvTidyUngetChar(uVar2,doc->docIn);
      uVar2 = value._4_4_;
    }
    value._4_4_ = uVar2;
    value._0_4_ = 0;
    munge = lexer_00->lexsize;
    delim = 0;
LAB_0015a63a:
    uVar2 = delim;
    delim = prvTidyReadChar(doc->docIn);
    if (delim != 0xffffffff) {
      if (value._4_4_ == 0) {
        if (delim == 0x3e) {
          prvTidyUngetChar(0x3e,doc->docIn);
          goto LAB_0015a96f;
        }
        if ((delim == 0x22) || (delim == 0x27)) {
          uVar3 = prvTidyReadChar(doc->docIn);
          if (uVar3 == 0x3e) {
            prvTidyAddCharToLexer(lexer_00,delim);
            prvTidyUngetChar(0x3e,doc->docIn);
            goto LAB_0015a96f;
          }
          prvTidyUngetChar(uVar3,doc->docIn);
        }
        if (delim == 0x3c) {
          prvTidyUngetChar(0x3c,doc->docIn);
          prvTidyUngetChar(0x3e,doc->docIn);
          prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x289);
          goto LAB_0015a96f;
        }
        if (delim == 0x2f) {
          uVar3 = prvTidyReadChar(doc->docIn);
          if ((uVar3 == 0x3e) && (BVar4 = prvTidyIsUrl(doc,name), BVar4 == no)) {
            *isempty = yes;
            prvTidyUngetChar(0x3e,doc->docIn);
            goto LAB_0015a96f;
          }
          prvTidyUngetChar(uVar3,doc->docIn);
          delim = 0x2f;
        }
      }
      else {
        if (delim == value._4_4_) goto LAB_0015a96f;
        if (((delim == 10) || (delim == 0x3c)) || (delim == 0x3e)) {
          value._0_4_ = (uint)value + 1;
        }
        if (delim == 0x3e) {
          bVar1 = true;
        }
      }
      if (delim == 0x26) {
        prvTidyAddCharToLexer(lexer_00,0x26);
        ParseEntity(doc,IgnoreWhitespace);
        if ((lexer_00->lexbuf[lexer_00->lexsize - 1] == '\n') && (bVar6)) {
          ChangeChar(lexer_00,' ');
        }
        goto LAB_0015a63a;
      }
      if ((delim == 0x5c) && (delim = prvTidyReadChar(doc->docIn), delim != 10)) {
        prvTidyUngetChar(delim,doc->docIn);
        delim = 0x5c;
      }
      BVar4 = prvTidyIsWhite(delim);
      if (BVar4 == no) {
        if ((foldCase != no) && (BVar4 = prvTidyIsUpper(delim), BVar4 != no)) {
          delim = prvTidyToLower(delim);
        }
      }
      else {
        if (value._4_4_ == 0) goto LAB_0015a96f;
        if (bVar6) {
          if ((delim == 10) && (BVar4 = prvTidyIsUrl(doc,name), BVar4 != no)) {
            prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x266);
            goto LAB_0015a63a;
          }
          delim = 0x20;
          if (uVar2 == 0x20) {
            BVar4 = prvTidyIsUrl(doc,name);
            if (BVar4 != no) {
              prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x290);
            }
            goto LAB_0015a63a;
          }
        }
      }
      prvTidyAddCharToLexer(lexer_00,delim);
      goto LAB_0015a63a;
    }
    prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x283);
    prvTidyUngetChar(0xffffffff,doc->docIn);
LAB_0015a96f:
    if (((((10 < (uint)value) && (bVar1)) && (bVar6)) &&
        (BVar4 = prvTidyIsScript(doc,name), BVar4 == no)) &&
       (((BVar4 = prvTidyIsUrl(doc,name), BVar4 == no ||
         (iVar5 = prvTidytmbstrncmp(lexer_00->lexbuf + (int)munge,"javascript:",0xb), iVar5 != 0))
        && (iVar5 = prvTidytmbstrncmp(lexer_00->lexbuf + (int)munge,"<xml ",5), iVar5 != 0)))) {
      prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x27d);
    }
    seen_gt = lexer_00->lexsize - munge;
    lexer_00->lexsize = munge;
    if (((int)seen_gt < 1) && (value._4_4_ == 0)) {
      pTStack_68 = (TidyDocImpl *)0x0;
    }
    else {
      if (((0 < (int)seen_gt) &&
          (((bVar6 && (iVar5 = prvTidytmbstrcasecmp(name,"alt"), iVar5 != 0)) &&
           (iVar5 = prvTidytmbstrcasecmp(name,"title"), iVar5 != 0)))) &&
         ((iVar5 = prvTidytmbstrcasecmp(name,"value"), iVar5 != 0 &&
          (iVar5 = prvTidytmbstrcasecmp(name,"prompt"), iVar5 != 0)))) {
        for (; BVar4 = prvTidyIsWhite((int)lexer_00->lexbuf[(int)(munge + seen_gt + -1)]),
            BVar4 != no && 0 < (int)seen_gt; seen_gt = seen_gt - yes) {
        }
        for (; BVar4 = prvTidyIsWhite((int)lexer_00->lexbuf[(int)munge]),
            BVar4 != no && 0 < (int)seen_gt; seen_gt = seen_gt - yes) {
          munge = munge + yes;
        }
      }
      pTStack_68 = (TidyDocImpl *)
                   prvTidytmbstrndup(doc->allocator,lexer_00->lexbuf + (int)munge,seen_gt);
    }
    *pdelim = value._4_4_;
    doc_local = pTStack_68;
  }
  else {
    prvTidyUngetChar(uVar2,doc->docIn);
    doc_local = (TidyDocImpl *)0x0;
  }
  return (tmbstr)doc_local;
}

Assistant:

static tmbstr ParseValue( TidyDocImpl* doc, ctmbstr name,
                          Bool foldCase, Bool *isempty, int *pdelim)
{
    Lexer* lexer = doc->lexer;
    int len = 0, start;
    Bool seen_gt = no;
    Bool munge = yes;
    uint c, lastc, delim, quotewarning;
    tmbstr value;

    delim = (tmbchar) 0;
    *pdelim = '"';

    /*
     Henry Zrepa reports that some folk are using the
     embed element with script attributes where newlines
     are significant and must be preserved
    */
    if ( cfgBool(doc, TidyLiteralAttribs) )
        munge = no;

 /* skip white space before the '=' */

    for (;;)
    {
        c = TY_(ReadChar)(doc->docIn);

        if (c == EndOfStream)
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (!TY_(IsWhite)(c))
           break;
    }

/*
  c should be '=' if there is a value
  other legal possibilities are white
  space, '/' and '>'
*/

    if (c != '=' && c != '"' && c != '\'')
    {
        TY_(UngetChar)(c, doc->docIn);
        return NULL;
    }

 /* skip white space after '=' */

    for (;;)
    {
        c = TY_(ReadChar)(doc->docIn);

        if (c == EndOfStream)
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (!TY_(IsWhite)(c))
           break;
    }

 /* check for quote marks */

    if (c == '"' || c == '\'')
        delim = c;
    else if (c == '<')
    {
        start = lexer->lexsize;
        TY_(AddCharToLexer)(lexer, c);
        *pdelim = ParseServerInstruction( doc );
        len = lexer->lexsize - start;
        lexer->lexsize = start;
        return (len > 0 ? TY_(tmbstrndup)(doc->allocator,
                                          lexer->lexbuf+start, len) : NULL);
    }
    else
        TY_(UngetChar)(c, doc->docIn);

 /*
   and read the value string
   check for quote mark if needed
 */

    quotewarning = 0;
    start = lexer->lexsize;
    c = '\0';

    for (;;)
    {
        lastc = c;  /* track last character */
        c = TY_(ReadChar)(doc->docIn);

        if (c == EndOfStream)
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_END_OF_FILE_ATTR );
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (delim == (tmbchar)0)
        {
            if (c == '>')
            {
                TY_(UngetChar)(c, doc->docIn);
                break;
            }

            if (c == '"' || c == '\'')
            {
                uint q = c;

                /* handle <input onclick=s("btn1")> and <a title=foo""">...</a> */
                /* this doesn't handle <a title=foo"/> which browsers treat as  */
                /* 'foo"/' nor  <a title=foo" /> which browser treat as 'foo"'  */
                
                c = TY_(ReadChar)(doc->docIn);
                if (c == '>')
                {
                    TY_(AddCharToLexer)(lexer, q);
                    TY_(UngetChar)(c, doc->docIn);
                    break;
                }
                else
                {
                    TY_(UngetChar)(c, doc->docIn);
                    c = q;
                }
            }

            if (c == '<')
            {
                TY_(UngetChar)(c, doc->docIn);
                c = '>';
                TY_(UngetChar)(c, doc->docIn);
                TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_GT );
                break;
            }

            /*
             For cases like <br clear=all/> need to avoid treating /> as
             part of the attribute value, however care is needed to avoid
             so treating <a href=http://www.acme.com/> in this way, which
             would map the <a> tag to <a href="http://www.acme.com"/>
            */
            if (c == '/')
            {
                /* peek ahead in case of /> */
                c = TY_(ReadChar)(doc->docIn);

                if ( c == '>' && !TY_(IsUrl)(doc, name) )
                {
                    *isempty = yes;
                    TY_(UngetChar)(c, doc->docIn);
                    break;
                }

                /* unget peeked character */
                TY_(UngetChar)(c, doc->docIn);
                c = '/';
            }
        }
        else  /* delim is '\'' or '"' */
        {
            if (c == delim)
                break;

            if (c == '\n' || c == '<' || c == '>')
                ++quotewarning;

            if (c == '>')
                seen_gt = yes;
        }

        if (c == '&')
        {
            TY_(AddCharToLexer)(lexer, c);
            ParseEntity( doc, IgnoreWhitespace );
            if (lexer->lexbuf[lexer->lexsize - 1] == '\n' && munge)
                ChangeChar(lexer, ' ');
            continue;
        }

        /*
         kludge for JavaScript attribute values
         with line continuations in string literals
        */
        if (c == '\\')
        {
            c = TY_(ReadChar)(doc->docIn);

            if (c != '\n')
            {
                TY_(UngetChar)(c, doc->docIn);
                c = '\\';
            }
        }

        if (TY_(IsWhite)(c))
        {
            if ( delim == 0 )
                break;

            if (munge)
            {
                /* discard line breaks in quoted URLs */ 
                /* #438650 - fix by Randy Waki */
                if ( c == '\n' && TY_(IsUrl)(doc, name) )
                {
                    /* warn that we discard this newline */
                    TY_(ReportAttrError)( doc, lexer->token, NULL, NEWLINE_IN_URI);
                    continue;
                }
                
                c = ' ';

                if (lastc == ' ')
                {
                    if (TY_(IsUrl)(doc, name) )
                        TY_(ReportAttrError)( doc, lexer->token, NULL, WHITE_IN_URI);
                    continue;
                }
            }
        }
        else if (foldCase && TY_(IsUpper)(c))
            c = TY_(ToLower)(c);

        TY_(AddCharToLexer)(lexer, c);
    }

    if (quotewarning > 10 && seen_gt && munge)
    {
        /*
           there is almost certainly a missing trailing quote mark
           as we have see too many newlines, < or > characters.

           an exception is made for Javascript attributes and the
           javascript URL scheme which may legitimately include < and >,
           and for attributes starting with "<xml " as generated by
           Microsoft Office.
        */
        if ( !TY_(IsScript)(doc, name) &&
             !(TY_(IsUrl)(doc, name) && TY_(tmbstrncmp)(lexer->lexbuf+start, "javascript:", 11) == 0) &&
             !(TY_(tmbstrncmp)(lexer->lexbuf+start, "<xml ", 5) == 0)
           )
            TY_(Report)( doc, NULL, NULL, SUSPECTED_MISSING_QUOTE ); 
    }

    len = lexer->lexsize - start;
    lexer->lexsize = start;


    if (len > 0 || delim)
    {
        /* ignore leading and trailing white space for all but title, alt, value */
        /* and prompts attributes unless --literal-attributes is set to yes      */
        /* #994841 - Whitespace is removed from value attributes                 */

        /* Issue #217 - Also only if/while (len > 0) - MUST NEVER GO NEGATIVE! */
        if ((len > 0) && munge &&
            TY_(tmbstrcasecmp)(name, "alt") &&
            TY_(tmbstrcasecmp)(name, "title") &&
            TY_(tmbstrcasecmp)(name, "value") &&
            TY_(tmbstrcasecmp)(name, "prompt"))
        {
            while (TY_(IsWhite)(lexer->lexbuf[start+len-1]) && (len > 0))
                --len;

            /* Issue #497 - Fix leading space trimming */
            while (TY_(IsWhite)(lexer->lexbuf[start]) && (len > 0))
            {
                ++start;
                --len;
            }
        }

        value = TY_(tmbstrndup)(doc->allocator, lexer->lexbuf + start, len);
    }
    else
        value = NULL;

    /* note delimiter if given */
    *pdelim = delim;

    return value;
}